

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  pointer data;
  bool bVar1;
  uint uVar2;
  LogMessage *other;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  size_t __n;
  LogMessage local_80;
  EpsCopyOutputStream *local_48;
  string *local_40;
  LogFinisher local_31;
  
  if (this->end_ <= ptr) {
    ptr = EnsureSpaceFallback(this,ptr);
  }
  uVar3 = s->_M_string_length;
  if (this->end_ <= ptr) {
    local_48 = this;
    local_40 = s;
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/coded_stream.h"
               ,0x35a);
    other = internal::LogMessage::operator<<(&local_80,"CHECK failed: ptr < end_: ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage(&local_80);
    this = local_48;
    s = local_40;
  }
  uVar6 = num << 3;
  if (uVar6 < 0x80) {
    *ptr = (byte)uVar6 | 2;
    pbVar4 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar6 | 0x82;
    if (uVar6 < 0x4000) {
      ptr[1] = (byte)(uVar6 >> 7);
      pbVar4 = ptr + 2;
    }
    else {
      pbVar4 = ptr + 2;
      uVar6 = uVar6 >> 7;
      do {
        pbVar5 = pbVar4;
        pbVar5[-1] = (byte)uVar6 | 0x80;
        uVar2 = uVar6 >> 7;
        pbVar4 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar2;
      } while (bVar1);
      *pbVar5 = (byte)uVar2;
    }
  }
  uVar6 = (uint)uVar3;
  if (uVar6 < 0x80) {
    uVar3 = uVar3 & 0xffffffff;
  }
  else {
    uVar3 = uVar3 & 0xffffffff;
    do {
      uVar2 = (uint)uVar3;
      *pbVar4 = (byte)uVar3 | 0x80;
      uVar3 = uVar3 >> 7;
      pbVar4 = pbVar4 + 1;
    } while (0x3fff < uVar2);
  }
  *pbVar4 = (byte)uVar3;
  pbVar4 = pbVar4 + 1;
  data = (s->_M_dataplus)._M_p;
  __n = (size_t)(int)uVar6;
  if ((long)this->end_ - (long)pbVar4 < (long)__n) {
    pbVar4 = WriteRawFallback(this,data,uVar6,pbVar4);
  }
  else {
    memcpy(pbVar4,data,__n);
    pbVar4 = pbVar4 + __n;
  }
  return pbVar4;
}

Assistant:

uint8* EpsCopyOutputStream::WriteStringOutline(uint32 num, const std::string& s,
                                               uint8* ptr) {
  ptr = EnsureSpace(ptr);
  uint32 size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}